

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O2

int32 mkvmuxer::GetUIntSize(uint64 value)

{
  int32 iVar1;
  
  if (value < 0x100) {
    iVar1 = 1;
  }
  else if (value < 0x10000) {
    iVar1 = 2;
  }
  else if (value < 0x1000000) {
    iVar1 = 3;
  }
  else if (value >> 0x20 == 0) {
    iVar1 = 4;
  }
  else if (value >> 0x28 == 0) {
    iVar1 = 5;
  }
  else {
    if (value >> 0x30 != 0) {
      return 8 - (uint)(value >> 0x38 == 0);
    }
    iVar1 = 6;
  }
  return iVar1;
}

Assistant:

int32 GetUIntSize(uint64 value) {
  if (value < 0x0000000000000100ULL)
    return 1;
  else if (value < 0x0000000000010000ULL)
    return 2;
  else if (value < 0x0000000001000000ULL)
    return 3;
  else if (value < 0x0000000100000000ULL)
    return 4;
  else if (value < 0x0000010000000000ULL)
    return 5;
  else if (value < 0x0001000000000000ULL)
    return 6;
  else if (value < 0x0100000000000000ULL)
    return 7;
  return 8;
}